

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Saig_Bmc_t *
Saig_BmcManStart(Aig_Man_t *pAig,int nFramesMax,int nNodesMax,int nConfMaxOne,int nConfMaxAll,
                int fVerbose)

{
  Vec_Ptr_t *p_00;
  lit lVar1;
  lit lVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Vec_Int_t *pVVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pNode;
  sat_solver *psVar8;
  lit local_40;
  lit local_3c;
  int Lit;
  int i;
  Aig_Obj_t *pObj;
  Saig_Bmc_t *p;
  int local_20;
  int fVerbose_local;
  int nConfMaxAll_local;
  int nConfMaxOne_local;
  int nNodesMax_local;
  int nFramesMax_local;
  Aig_Man_t *pAig_local;
  
  p._4_4_ = fVerbose;
  local_20 = nConfMaxAll;
  fVerbose_local = nConfMaxOne;
  nConfMaxAll_local = nNodesMax;
  nConfMaxOne_local = nFramesMax;
  _nNodesMax_local = pAig;
  pObj = (Aig_Obj_t *)malloc(0x80);
  memset(pObj,0,0x80);
  (pObj->field_0).CioId = nConfMaxOne_local;
  *(int *)((long)&pObj->field_0 + 4) = nConfMaxAll_local;
  *(int *)&pObj->pFanin0 = fVerbose_local;
  *(int *)((long)&pObj->pFanin0 + 4) = local_20;
  *(int *)&pObj->pFanin1 = p._4_4_;
  *(Aig_Man_t **)&pObj->field_0x18 = _nNodesMax_local;
  iVar3 = Aig_ManObjNumMax(_nNodesMax_local);
  pObj[1].field_0.CioId = iVar3;
  pAVar4 = (Aig_Obj_t *)Vec_PtrAlloc(100);
  pObj[1].pFanin0 = pAVar4;
  pVVar5 = Vec_IntAlloc(0);
  *(Vec_Int_t **)&pObj[1].TravId = pVVar5;
  Vec_IntFill(*(Vec_Int_t **)&pObj[1].TravId,pObj[1].field_0.CioId,0);
  pAVar6 = Aig_ManStart(pObj[1].field_0.CioId);
  *(Aig_Man_t **)&pObj->TravId = pAVar6;
  for (local_3c = 0; lVar1 = local_3c, iVar3 = Saig_ManRegNum(_nNodesMax_local), lVar2 = local_3c,
      lVar1 < iVar3; local_3c = local_3c + 1) {
    p_00 = _nNodesMax_local->vCis;
    iVar3 = Saig_ManPiNum(_nNodesMax_local);
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p_00,lVar2 + iVar3);
    pAVar4 = pObj;
    _Lit = pAVar7;
    pNode = Aig_ManConst0(*(Aig_Man_t **)&pObj->TravId);
    Saig_BmcObjSetFrame((Saig_Bmc_t *)pAVar4,pAVar7,0,pNode);
  }
  *(undefined4 *)&pObj[1].field_0x18 = 1;
  psVar8 = sat_solver_new();
  pObj[1].pFanin1 = (Aig_Obj_t *)psVar8;
  *(undefined4 *)((long)&pObj[1].pFanin1[9].field_0 + 4) = 10000;
  *(undefined4 *)&pObj[1].pFanin1[9].pFanin0 = 5000;
  *(undefined4 *)((long)&pObj[1].pFanin1[9].pFanin0 + 4) = 0x4b;
  pObj[1].pFanin1[9].field_0.CioId = *(int *)((long)&pObj[1].pFanin1[9].field_0 + 4);
  sat_solver_setnvars((sat_solver *)pObj[1].pFanin1,2000);
  local_40 = toLit(*(int *)&pObj[1].field_0x18);
  sat_solver_addclause((sat_solver *)pObj[1].pFanin1,&local_40,&local_3c);
  pAVar4 = pObj;
  pAVar7 = Aig_ManConst1(*(Aig_Man_t **)&pObj->TravId);
  iVar3 = *(int *)&pObj[1].field_0x18;
  *(int *)&pObj[1].field_0x18 = iVar3 + 1;
  Saig_BmcSetSatNum((Saig_Bmc_t *)pAVar4,pAVar7,iVar3);
  pAVar4 = (Aig_Obj_t *)Vec_PtrAlloc(1000);
  pObj[2].field_0.pNext = pAVar4;
  pVVar5 = Vec_IntAlloc(1000);
  (pObj->field_5).pData = pVVar5;
  *(undefined4 *)&pObj[2].field_0x18 = 0xffffffff;
  *(undefined4 *)((long)&pObj[2].pFanin1 + 4) = 0xffffffff;
  return (Saig_Bmc_t *)pObj;
}

Assistant:

Saig_Bmc_t * Saig_BmcManStart( Aig_Man_t * pAig, int nFramesMax, int nNodesMax, int nConfMaxOne, int nConfMaxAll, int fVerbose )
{
    Saig_Bmc_t * p;
    Aig_Obj_t * pObj;
    int i, Lit;
//    assert( Aig_ManRegNum(pAig) > 0 );
    p = (Saig_Bmc_t *)ABC_ALLOC( char, sizeof(Saig_Bmc_t) );
    memset( p, 0, sizeof(Saig_Bmc_t) );
    // set parameters
    p->nFramesMax   = nFramesMax;
    p->nNodesMax    = nNodesMax;
    p->nConfMaxOne  = nConfMaxOne;
    p->nConfMaxAll  = nConfMaxAll;
    p->fVerbose     = fVerbose;
    p->pAig         = pAig;
    p->nObjs        = Aig_ManObjNumMax(pAig);
    // create node and variable mappings
    p->vAig2Frm     = Vec_PtrAlloc( 100 );
    p->vObj2Var     = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vObj2Var, p->nObjs, 0 );
    // start the AIG manager and map primary inputs
    p->pFrm         = Aig_ManStart( p->nObjs );
    Saig_ManForEachLo( pAig, pObj, i )
        Saig_BmcObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrm) ); 
    // create SAT solver
    p->nSatVars     = 1;
    p->pSat         = sat_solver_new();
    p->pSat->nLearntStart = 10000;//p->pPars->nLearnedStart;
    p->pSat->nLearntDelta =  5000;//p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio =    75;//p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    sat_solver_setnvars( p->pSat, 2000 );
    Lit = toLit( p->nSatVars );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    Saig_BmcSetSatNum( p, Aig_ManConst1(p->pFrm), p->nSatVars++ );
    // other data structures
    p->vTargets     = Vec_PtrAlloc( 1000 );
    p->vVisited     = Vec_IntAlloc( 1000 );
    p->iOutputFail  = -1;
    p->iFrameFail   = -1;
    return p;
}